

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.hpp
# Opt level: O0

void __thiscall
jsoncons::stream_source<wchar_t>::stream_source
          (stream_source<wchar_t> *this,basic_istream<wchar_t,_std::char_traits<wchar_t>_> *is,
          size_t buf_size)

{
  vector<wchar_t,_std::allocator<wchar_t>_> *pvVar1;
  pointer pwVar2;
  wchar_t *pwVar3;
  pointer in_RSI;
  vector<wchar_t,_std::allocator<wchar_t>_> *in_RDI;
  basic_null_istream<wchar_t> *in_stack_ffffffffffffffb0;
  allocator_type *__a;
  vector<wchar_t,_std::allocator<wchar_t>_> *this_00;
  allocator_type local_25 [21];
  pointer local_10;
  
  this_00 = in_RDI;
  local_10 = in_RSI;
  basic_null_istream<wchar_t>::basic_null_istream(in_stack_ffffffffffffffb0);
  this_00[0xe].super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.super__Vector_impl_data
  ._M_finish = local_10;
  pvVar1 = this_00 + 0xe;
  pwVar2 = (pointer)std::wios::rdbuf();
  (pvVar1->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pwVar2;
  in_RDI[0xf].super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __a = local_25;
  std::allocator<wchar_t>::allocator();
  std::vector<wchar_t,_std::allocator<wchar_t>_>::vector(this_00,(size_type)in_RDI,__a);
  std::allocator<wchar_t>::~allocator(local_25);
  pwVar3 = std::vector<wchar_t,_std::allocator<wchar_t>_>::data
                     ((vector<wchar_t,_std::allocator<wchar_t>_> *)0x9e7b13);
  in_RDI[0x10].super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.super__Vector_impl_data
  ._M_finish = pwVar3;
  in_RDI[0x10].super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

stream_source(std::basic_istream<char_type>& is, std::size_t buf_size = default_max_buffer_size)
            : stream_ptr_(std::addressof(is)), sbuf_(is.rdbuf()),
              buffer_(buf_size), buffer_data_(buffer_.data())
        {
        }